

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::addQualifierToExisting
          (HlslParseContext *this,TSourceLoc *loc,TQualifier qualifier,TString *identifier)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TQualifier *this_00;
  undefined4 extraout_var_03;
  TSymbol *local_28;
  TSymbol *symbol;
  TString *identifier_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  local_28 = TSymbolTable::find((this->super_TParseContextBase).symbolTable,identifier,(bool *)0x0,
                                (bool *)0x0,(int *)0x0);
  if (local_28 == (TSymbol *)0x0) {
    pcVar4 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       (identifier);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"identifier not previously declared",pcVar4,"");
  }
  else {
    iVar2 = (*local_28->_vptr_TSymbol[7])();
    if (CONCAT44(extraout_var,iVar2) == 0) {
      bVar1 = TQualifier::isAuxiliary(&qualifier);
      if ((((bVar1) || (bVar1 = TQualifier::isMemory(&qualifier), bVar1)) ||
          (bVar1 = TQualifier::isInterpolation(&qualifier), bVar1)) ||
         (((bVar1 = TQualifier::hasLayout(&qualifier), bVar1 ||
           (((undefined1  [80])qualifier & (undefined1  [80])0x7f) != (undefined1  [80])0x0)) ||
          (((ulong)qualifier._8_8_ >> 0x19 & 7) != 0)))) {
        pcVar4 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           (identifier);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,
                   "cannot add storage, auxiliary, memory, interpolation, layout, or precision qualifier to an existing variable"
                   ,pcVar4,"");
      }
      else {
        uVar3 = (*local_28->_vptr_TSymbol[0x14])();
        if ((uVar3 & 1) != 0) {
          local_28 = TSymbolTable::copyUp((this->super_TParseContextBase).symbolTable,local_28);
        }
        if (((ulong)qualifier._8_8_ >> 0x1c & 1) == 0) {
          if (((ulong)qualifier._8_8_ >> 0x24 & 1) == 0) {
            if (((ulong)qualifier._8_8_ >> 0x20 & 1) == 0) {
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                        (this,loc,"unknown requalification","");
            }
            else {
              iVar2 = (*local_28->_vptr_TSymbol[0xd])();
              this_00 = (TQualifier *)
                        (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x50))();
              TQualifier::makeSpecConstant(this_00);
              bVar1 = TQualifier::hasSpecConstantId(&qualifier);
              if (bVar1) {
                uVar3 = qualifier._40_4_;
                iVar2 = (*local_28->_vptr_TSymbol[0xd])();
                lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar2) + 0x50))();
                *(ulong *)(lVar5 + 0x24) =
                     *(ulong *)(lVar5 + 0x24) & 0xfff800ffffffffff |
                     (ulong)(uVar3 >> 8 & 0x7ff) << 0x28;
              }
            }
          }
          else {
            bVar1 = TIntermediate::inIoAccessed
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               identifier);
            if (bVar1) {
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"cannot change qualification after use","precise","");
            }
            iVar2 = (*local_28->_vptr_TSymbol[0xd])();
            lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x50))();
            *(ulong *)(lVar5 + 8) = *(ulong *)(lVar5 + 8) & 0xffffffefffffffff | 0x1000000000;
          }
        }
        else {
          bVar1 = TIntermediate::inIoAccessed
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                             identifier);
          if (bVar1) {
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"cannot change qualification after use","invariant","");
          }
          iVar2 = (*local_28->_vptr_TSymbol[0xd])();
          lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x50))();
          *(ulong *)(lVar5 + 8) = *(ulong *)(lVar5 + 8) & 0xffffffffefffffff | 0x10000000;
        }
      }
    }
    else {
      pcVar4 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (identifier);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot re-qualify a function name",pcVar4,"");
    }
  }
  return;
}

Assistant:

void HlslParseContext::addQualifierToExisting(const TSourceLoc& loc, TQualifier qualifier, const TString& identifier)
{
    TSymbol* symbol = symbolTable.find(identifier);
    if (symbol == nullptr) {
        error(loc, "identifier not previously declared", identifier.c_str(), "");
        return;
    }
    if (symbol->getAsFunction()) {
        error(loc, "cannot re-qualify a function name", identifier.c_str(), "");
        return;
    }

    if (qualifier.isAuxiliary() ||
        qualifier.isMemory() ||
        qualifier.isInterpolation() ||
        qualifier.hasLayout() ||
        qualifier.storage != EvqTemporary ||
        qualifier.precision != EpqNone) {
        error(loc, "cannot add storage, auxiliary, memory, interpolation, layout, or precision qualifier to an existing variable", identifier.c_str(), "");
        return;
    }

    // For read-only built-ins, add a new symbol for holding the modified qualifier.
    // This will bring up an entire block, if a block type has to be modified (e.g., gl_Position inside a block)
    if (symbol->isReadOnly())
        symbol = symbolTable.copyUp(symbol);

    if (qualifier.invariant) {
        if (intermediate.inIoAccessed(identifier))
            error(loc, "cannot change qualification after use", "invariant", "");
        symbol->getWritableType().getQualifier().invariant = true;
    } else if (qualifier.noContraction) {
        if (intermediate.inIoAccessed(identifier))
            error(loc, "cannot change qualification after use", "precise", "");
        symbol->getWritableType().getQualifier().noContraction = true;
    } else if (qualifier.specConstant) {
        symbol->getWritableType().getQualifier().makeSpecConstant();
        if (qualifier.hasSpecConstantId())
            symbol->getWritableType().getQualifier().layoutSpecConstantId = qualifier.layoutSpecConstantId;
    } else
        warn(loc, "unknown requalification", "", "");
}